

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::ConstantNamePrefix
                   (string *__return_storage_ptr__,string *classname)

{
  pointer pcVar1;
  undefined1 *puVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  string lower;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (classname->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + classname->_M_string_length);
  puVar2 = local_50;
  if (local_48 != 0) {
    lVar6 = 0;
    do {
      iVar4 = tolower((int)(char)puVar2[lVar6]);
      puVar2[lVar6] = (char)iVar4;
      lVar6 = lVar6 + 1;
    } while (local_48 != lVar6);
  }
  iVar4 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar4 == 0) {
    bVar7 = true;
  }
  else {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (uVar5 == 0x4c) break;
      iVar4 = std::__cxx11::string::compare((char *)&local_50);
      uVar3 = uVar5 + 1;
    } while (iVar4 != 0);
    bVar7 = uVar5 < 0x4c;
  }
  lVar6 = 0;
  do {
    iVar4 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar4 == 0) goto LAB_0027e3c7;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x24);
  if (bVar7) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
  }
  else {
LAB_0027e3c7:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstantNamePrefix(const std::string& classname) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  for (int i = 0; i < kValidConstantNamesSize; i++) {
    if (lower == kValidConstantNames[i]) {
      is_reserved = false;
      break;
    }
  }

  if (is_reserved) {
    return "PB";
  }

  return "";
}